

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::output_example(vw *all,cb_explore_adf *c,multi_ex *ec_seq)

{
  undefined4 uVar1;
  code *pcVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  size_type sVar5;
  reference ppeVar6;
  ulong uVar7;
  size_t sVar8;
  cb_class *pcVar9;
  action_score *paVar10;
  int **ppiVar11;
  ostream *poVar12;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  float fVar13;
  size_t i_2;
  v_array<CB::cb_class> costs;
  stringstream outputStringStream;
  string outputString;
  int sink;
  int *__end1_1;
  int *__begin1_1;
  v_array<int> *__range1_1;
  size_t i_1;
  bool holdout_example;
  float l;
  uint32_t i;
  bool labeled_example;
  example **example;
  iterator __end1;
  iterator __begin1;
  multi_ex *__range1;
  action_scores preds;
  example *ec;
  float loss;
  size_t num_features;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  string local_2a8 [32];
  ulong local_288;
  v_array<CB::cb_class> local_280;
  stringstream local_250 [16];
  ostream local_240;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  v_array<ACTION_SCORE::action_score> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff1f;
  vw *in_stack_ffffffffffffff20;
  string local_c8 [36];
  int local_a4;
  int *local_a0;
  int *local_98;
  v_array<int> *local_90;
  ulong local_88;
  bool local_7d;
  float local_7c;
  uint local_78;
  byte local_71;
  reference local_70;
  example **local_68;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_60;
  vector<example_*,_std::allocator<example_*>_> *local_58;
  v_array<ACTION_SCORE::action_score> local_50;
  value_type local_30;
  float local_24;
  size_t local_20;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  long local_10;
  undefined8 *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar5 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  if (sVar5 != 0) {
    local_20 = 0;
    local_24 = 0.0;
    ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
    local_30 = *ppeVar6;
    local_50._begin = (action_score *)(local_30->pred).scalars._begin;
    local_50._end = (action_score *)(local_30->pred).scalars._end;
    local_50.end_array = (action_score *)(local_30->pred).scalars.end_array;
    local_50.erase_count = (local_30->pred).scalars.erase_count;
    local_58 = local_18;
    local_60._M_current =
         (example **)
         std::vector<example_*,_std::allocator<example_*>_>::begin
                   ((vector<example_*,_std::allocator<example_*>_> *)
                    CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    local_68 = (example **)
               std::vector<example_*,_std::allocator<example_*>_>::end
                         ((vector<example_*,_std::allocator<example_*>_> *)
                          CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                              (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)),
          bVar3) {
      local_70 = __gnu_cxx::
                 __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                 ::operator*(&local_60);
      local_20 = (*local_70)->num_features + local_20;
      __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
      ::operator++(&local_60);
    }
    local_71 = 1;
    if (*(float *)(local_10 + 0x120) <= 0.0) {
      local_71 = 0;
    }
    else {
      for (local_78 = 0; uVar7 = (ulong)local_78,
          sVar8 = v_array<ACTION_SCORE::action_score>::size(&local_50), uVar7 < sVar8;
          local_78 = local_78 + 1) {
        pcVar9 = (cb_class *)(local_10 + 0x118);
        paVar10 = v_array<ACTION_SCORE::action_score>::operator[](&local_50,(ulong)local_78);
        fVar13 = CB_ALGS::get_unbiased_cost(pcVar9,paVar10->action,0.0);
        local_7c = fVar13;
        paVar10 = v_array<ACTION_SCORE::action_score>::operator[](&local_50,(ulong)local_78);
        local_24 = fVar13 * paVar10->score + local_24;
      }
    }
    local_7d = (bool)(local_71 & 1);
    for (local_88 = 0; uVar7 = local_88,
        sVar5 = std::vector<example_*,_std::allocator<example_*>_>::size(local_18), uVar7 < sVar5;
        local_88 = local_88 + 1) {
      ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,local_88);
      local_7d = (local_7d & 1U & (*ppeVar6)->test_only & 1U) != 0;
    }
    shared_data::update((shared_data *)*local_8,(bool)(local_7d & 1),(bool)(local_71 & 1),local_24,
                        local_30->weight,local_20);
    local_90 = (v_array<int> *)(local_8 + 0x6a2);
    ppiVar11 = v_array<int>::begin(local_90);
    local_98 = *ppiVar11;
    ppiVar11 = v_array<int>::end(local_90);
    local_a0 = *ppiVar11;
    for (; local_98 != local_a0; local_98 = local_98 + 1) {
      local_a4 = *local_98;
      ACTION_SCORE::print_action_score
                (in_stack_ffffffffffffff14,in_stack_ffffffffffffff08,
                 (v_array<char> *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    }
    if (0 < *(int *)(local_8 + 0x6a6)) {
      std::__cxx11::string::string(local_c8);
      _Var4 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_250,local_c8,_Var4);
      local_280._begin = *(cb_class **)&(local_30->l).multi;
      local_280._end = (cb_class *)(local_30->l).cs.costs._end;
      local_280.end_array = (cb_class *)(local_30->l).cs.costs.end_array;
      local_280.erase_count = (local_30->l).cs.costs.erase_count;
      for (local_288 = 0; uVar7 = local_288, sVar8 = v_array<CB::cb_class>::size(&local_280),
          uVar7 < sVar8; local_288 = local_288 + 1) {
        if (local_288 != 0) {
          std::operator<<(&local_240,' ');
        }
        pcVar9 = v_array<CB::cb_class>::operator[](&local_280,local_288);
        poVar12 = (ostream *)std::ostream::operator<<(&local_240,pcVar9->action);
        poVar12 = std::operator<<(poVar12,':');
        pcVar9 = v_array<CB::cb_class>::operator[](&local_280,local_288);
        std::ostream::operator<<(poVar12,pcVar9->partial_prediction);
      }
      pcVar2 = (code *)local_8[0x6a8];
      uVar1 = *(undefined4 *)(local_8 + 0x6a6);
      std::__cxx11::stringstream::str();
      (*pcVar2)(uVar1,local_2a8);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::stringstream::~stringstream(local_250);
      std::__cxx11::string::~string(local_c8);
    }
    CB::print_update(in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f,
                     (example *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (multi_ex *)in_stack_ffffffffffffff08,(bool)in_stack_ffffffffffffff07);
  }
  return;
}

Assistant:

void output_example(vw& all, cb_explore_adf& c, multi_ex& ec_seq)
{
  if (ec_seq.size() <= 0)
    return;

  size_t num_features = 0;

  float loss = 0.;

  auto& ec = *ec_seq[0];
  ACTION_SCORE::action_scores preds = ec.pred.a_s;

  for (const auto& example : ec_seq)
  {
    num_features += example->num_features;
  }

  bool labeled_example = true;
  if (c.gen_cs.known_cost.probability > 0)
  {
    for (uint32_t i = 0; i < preds.size(); i++)
    {
      float l = get_unbiased_cost(&c.gen_cs.known_cost, preds[i].action);
      loss += l * preds[i].score;
    }
  }
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq.size(); i++) holdout_example &= ec_seq[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);

  for (int sink : all.final_prediction_sink) print_action_score(sink, ec.pred.a_s, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    v_array<CB::cb_class> costs = ec.l.cb.costs;

    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, &ec_seq, true);
}